

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O1

void __thiscall
Assimp::OptimizeGraphProcess::CollectNewChildren
          (OptimizeGraphProcess *this,aiNode *nd,list<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  char *pcVar1;
  size_t *psVar2;
  long *******ppppppplVar3;
  pointer pcVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint uVar25;
  _List_node_base *p_Var26;
  aiNode *paVar27;
  aiMesh *pMesh;
  aiVector3D *paVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  list<aiNode_*,_std::allocator<aiNode_*>_> *plVar35;
  int iVar36;
  aiNode **tmp;
  size_t sVar37;
  iterator iVar38;
  _List_node_base *p_Var39;
  _List_node_base *p_Var40;
  _List_node_base *p_Var41;
  long *******ppppppplVar42;
  aiNode **ppaVar43;
  ulong uVar44;
  int iVar45;
  long lVar46;
  ulong uVar47;
  long *******ppppppplVar48;
  OptimizeGraphProcess *pOVar49;
  bool bVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  list<aiNode_*,_std::allocator<aiNode_*>_> child_nodes;
  aiMatrix4x4 inv;
  list<aiNode_*,_std::allocator<aiNode_*>_> join;
  list<aiNode_*,_std::allocator<aiNode_*>_> local_f8;
  _List_node_base *local_e0;
  OptimizeGraphProcess *local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8 [32];
  undefined8 uStack_a8;
  float local_a0;
  float local_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float local_8c;
  undefined1 local_88 [16];
  LockedSetType *local_78;
  list<aiNode_*,_std::allocator<aiNode_*>_> *local_70;
  long *******local_68;
  long *******local_60;
  long local_58;
  key_type local_50;
  
  this->nodes_in = this->nodes_in + nd->mNumChildren;
  local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_f8;
  local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_f8;
  local_70 = nodes;
  if (nd->mNumChildren != 0) {
    uVar47 = 0;
    do {
      CollectNewChildren(this,nd->mChildren[uVar47],&local_f8);
      nd->mChildren[uVar47] = (aiNode *)0x0;
      uVar47 = uVar47 + 1;
    } while (uVar47 < nd->mNumChildren);
  }
  pcVar1 = (nd->mName).data;
  pcVar4 = local_c8 + 0x10;
  local_c8._0_8_ = pcVar4;
  sVar37 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,pcVar1,(nd->mName).data + sVar37);
  local_78 = &this->locked;
  iVar38 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&local_78->_M_t,(key_type *)local_c8);
  local_d0 = &(this->locked)._M_t._M_impl.super__Rb_tree_header._M_header;
  if ((pointer)local_c8._0_8_ != pcVar4) {
    operator_delete((void *)local_c8._0_8_,CONCAT44(local_c8._20_4_,local_c8._16_4_) + 1);
  }
  local_d8 = this;
  if (iVar38._M_node == local_d0) {
    if (local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&local_f8) {
      p_Var39 = local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      do {
        p_Var41 = p_Var39[1]._M_next;
        pcVar1 = (char *)((long)&p_Var41->_M_next + 4);
        local_c8._0_8_ = pcVar4;
        sVar37 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,pcVar1,(long)&p_Var41->_M_next + sVar37 + 4);
        iVar38 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_78->_M_t,(key_type *)local_c8);
        if ((pointer)local_c8._0_8_ != pcVar4) {
          operator_delete((void *)local_c8._0_8_,CONCAT44(local_c8._20_4_,local_c8._16_4_) + 1);
        }
        if (iVar38._M_node == local_d0) {
          p_Var41 = p_Var39[1]._M_next;
          fVar5 = (nd->mTransformation).a1;
          fVar6 = (nd->mTransformation).a2;
          fVar51 = (nd->mTransformation).a3;
          fVar7 = (nd->mTransformation).a4;
          fVar8 = *(float *)((long)&p_Var41[0x41]._M_next + 4);
          fVar9 = *(float *)((long)&p_Var41[0x40]._M_next + 4);
          fVar10 = *(float *)&p_Var41[0x40]._M_prev;
          local_88._0_4_ = fVar10;
          fVar11 = *(float *)((long)&p_Var41[0x42]._M_next + 4);
          fVar12 = *(float *)((long)&p_Var41[0x43]._M_next + 4);
          fVar57 = fVar12 * fVar7 + fVar11 * fVar51 + fVar9 * fVar5 + fVar6 * fVar8;
          local_e0 = (_List_node_base *)CONCAT44(local_e0._4_4_,fVar57);
          fVar52 = *(float *)&p_Var41[0x41]._M_prev;
          fVar53 = *(float *)&p_Var41[0x42]._M_prev;
          fVar63 = *(float *)&p_Var41[0x43]._M_prev;
          fVar54 = *(float *)((long)&p_Var41[0x41]._M_prev + 4);
          fVar55 = *(float *)((long)&p_Var41[0x40]._M_prev + 4);
          fVar58 = *(float *)((long)&p_Var41[0x42]._M_prev + 4);
          fVar59 = *(float *)((long)&p_Var41[0x43]._M_prev + 4);
          fVar56 = *(float *)&p_Var41[0x42]._M_next;
          fVar60 = *(float *)&p_Var41[0x41]._M_next;
          fVar61 = *(float *)&p_Var41[0x43]._M_next;
          fVar62 = *(float *)&p_Var41[0x44]._M_next;
          fVar13 = (nd->mTransformation).b2;
          fVar14 = (nd->mTransformation).b1;
          fVar15 = (nd->mTransformation).b3;
          fVar16 = (nd->mTransformation).b4;
          fVar17 = (nd->mTransformation).c2;
          fVar18 = (nd->mTransformation).c1;
          fVar19 = (nd->mTransformation).c3;
          fVar20 = (nd->mTransformation).c4;
          fVar21 = (nd->mTransformation).d2;
          fVar22 = (nd->mTransformation).d1;
          fVar23 = (nd->mTransformation).d3;
          fVar24 = (nd->mTransformation).d4;
          *(float *)((long)&p_Var41[0x40]._M_next + 4) = fVar57;
          *(float *)&p_Var41[0x40]._M_prev =
               fVar63 * fVar7 + fVar53 * fVar51 + fVar10 * fVar5 + fVar6 * fVar52;
          *(float *)((long)&p_Var41[0x40]._M_prev + 4) =
               fVar59 * fVar7 + fVar58 * fVar51 + fVar55 * fVar5 + fVar6 * fVar54;
          *(float *)&p_Var41[0x41]._M_next =
               fVar7 * fVar62 + fVar51 * fVar61 + fVar5 * fVar60 + fVar6 * fVar56;
          *(float *)((long)&p_Var41[0x41]._M_next + 4) =
               fVar12 * fVar16 + fVar11 * fVar15 + fVar9 * fVar14 + fVar13 * fVar8;
          *(float *)&p_Var41[0x41]._M_prev =
               fVar63 * fVar16 + fVar53 * fVar15 + fVar10 * fVar14 + fVar13 * fVar52;
          *(float *)((long)&p_Var41[0x41]._M_prev + 4) =
               fVar59 * fVar16 + fVar58 * fVar15 + fVar55 * fVar14 + fVar13 * fVar54;
          *(float *)&p_Var41[0x42]._M_next =
               fVar16 * fVar62 + fVar15 * fVar61 + fVar14 * fVar60 + fVar13 * fVar56;
          *(float *)((long)&p_Var41[0x42]._M_next + 4) =
               fVar12 * fVar20 + fVar11 * fVar19 + fVar9 * fVar18 + fVar17 * fVar8;
          *(float *)&p_Var41[0x42]._M_prev =
               fVar63 * fVar20 + fVar53 * fVar19 + fVar10 * fVar18 + fVar17 * fVar52;
          *(float *)((long)&p_Var41[0x42]._M_prev + 4) =
               fVar59 * fVar20 + fVar58 * fVar19 + fVar55 * fVar18 + fVar17 * fVar54;
          *(float *)&p_Var41[0x43]._M_next =
               fVar20 * fVar62 + fVar19 * fVar61 + fVar18 * fVar60 + fVar17 * fVar56;
          *(float *)((long)&p_Var41[0x43]._M_next + 4) =
               fVar12 * fVar24 + fVar11 * fVar23 + fVar9 * fVar22 + fVar8 * fVar21;
          *(float *)&p_Var41[0x43]._M_prev =
               fVar63 * fVar24 + fVar53 * fVar23 + fVar10 * fVar22 + fVar52 * fVar21;
          *(float *)((long)&p_Var41[0x43]._M_prev + 4) =
               fVar59 * fVar24 + fVar58 * fVar23 + fVar55 * fVar22 + fVar54 * fVar21;
          *(float *)&p_Var41[0x44]._M_next =
               fVar62 * fVar24 + fVar61 * fVar23 + fVar60 * fVar22 + fVar21 * fVar56;
          p_Var41 = (_List_node_base *)operator_new(0x18);
          plVar35 = local_70;
          p_Var41[1]._M_next = p_Var39[1]._M_next;
          std::__detail::_List_node_base::_M_hook(p_Var41);
          psVar2 = &(plVar35->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node
                    ._M_size;
          *psVar2 = *psVar2 + 1;
          p_Var41 = p_Var39->_M_next;
          local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
               local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
               _M_size - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var39,0x18);
        }
        else {
          p_Var41 = p_Var39->_M_next;
        }
        p_Var39 = p_Var41;
      } while (p_Var41 != (_List_node_base *)&local_f8);
    }
    if ((nd->mNumMeshes == 0) &&
       (local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&local_f8)) {
      if (nd != (aiNode *)0x0) {
        aiNode::~aiNode(nd);
        operator_delete(nd,0x478);
      }
      goto LAB_003e4e84;
    }
    p_Var39 = (_List_node_base *)operator_new(0x18);
    plVar35 = local_70;
    pOVar49 = local_d8;
    p_Var39[1]._M_next = (_List_node_base *)nd;
    std::__detail::_List_node_base::_M_hook(p_Var39);
    psVar2 = &(plVar35->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
              _M_size;
    *psVar2 = *psVar2 + 1;
  }
  else {
    p_Var39 = (_List_node_base *)operator_new(0x18);
    plVar35 = local_70;
    p_Var39[1]._M_next = (_List_node_base *)nd;
    std::__detail::_List_node_base::_M_hook(p_Var39);
    psVar2 = &(plVar35->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
              _M_size;
    *psVar2 = *psVar2 + 1;
    local_c8._0_4_ = 1.0;
    local_c8._4_4_ = 0.0;
    local_c8._8_4_ = 0.0;
    local_c8._12_4_ = 0.0;
    local_c8._16_4_ = 0.0;
    local_c8._20_4_ = 1.0;
    local_c8._24_8_ = 0;
    uStack_a8._0_4_ = 0.0;
    uStack_a8._4_4_ = 0.0;
    local_a0 = 1.0;
    local_9c = 0.0;
    fStack_98 = 0.0;
    fStack_94 = 0.0;
    fStack_90 = 0.0;
    local_8c = 1.0;
    local_68 = (long *******)&local_68;
    local_58 = 0;
    local_60 = local_68;
    if (local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&local_f8) {
      p_Var39 = (_List_node_base *)0x0;
    }
    else {
      p_Var39 = (_List_node_base *)0x0;
      p_Var41 = local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      do {
        p_Var26 = p_Var41[1]._M_next;
        if (*(int *)&p_Var26[0x45]._M_next == 0) {
          pcVar1 = (char *)((long)&p_Var26->_M_next + 4);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar37 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar1,(long)&p_Var26->_M_next + sVar37 + 4);
          iVar38 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_78->_M_t,&local_50);
          bVar50 = iVar38._M_node == local_d0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar50 = false;
        }
        if (bVar50) {
          uVar25 = *(uint *)&p_Var26[0x46]._M_next;
          if (uVar25 == 0) {
            uVar47 = 0;
          }
          else {
            uVar47 = 0;
            do {
              if (1 < (local_d8->meshes).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [*(uint *)((long)&(p_Var26[0x46]._M_prev)->_M_next + uVar47 * 4)])
              goto LAB_003e3774;
              uVar47 = uVar47 + 1;
            } while (uVar25 != (uint)uVar47);
            uVar47 = (ulong)uVar25;
          }
LAB_003e3774:
          bVar50 = true;
          p_Var40 = p_Var41;
          if ((uint)uVar47 == uVar25) {
            if (p_Var39 == (_List_node_base *)0x0) {
              uVar29 = *(undefined8 *)((long)&p_Var26[0x40]._M_next + 4);
              uVar30 = *(undefined8 *)((long)&p_Var26[0x40]._M_prev + 4);
              uVar31 = *(undefined8 *)((long)&p_Var26[0x41]._M_next + 4);
              local_c8._24_8_ = *(undefined8 *)((long)&p_Var26[0x41]._M_prev + 4);
              uStack_a8 = *(undefined8 *)((long)&p_Var26[0x42]._M_next + 4);
              uVar32 = *(undefined8 *)((long)&p_Var26[0x42]._M_prev + 4);
              uVar33 = *(undefined8 *)((long)&p_Var26[0x43]._M_next + 4);
              uVar34 = *(undefined8 *)((long)&p_Var26[0x43]._M_prev + 4);
              fStack_98 = (float)uVar33;
              fStack_94 = (float)((ulong)uVar33 >> 0x20);
              fStack_90 = (float)uVar34;
              local_8c = (float)((ulong)uVar34 >> 0x20);
              local_a0 = (float)uVar32;
              local_9c = (float)((ulong)uVar32 >> 0x20);
              local_c8._16_4_ = (undefined4)uVar31;
              local_c8._20_4_ = (undefined4)((ulong)uVar31 >> 0x20);
              local_c8._0_4_ = (undefined4)uVar29;
              local_c8._4_4_ = (undefined4)((ulong)uVar29 >> 0x20);
              local_c8._8_4_ = (undefined4)uVar30;
              local_c8._12_4_ = (undefined4)((ulong)uVar30 >> 0x20);
              aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_c8);
              p_Var39 = p_Var26;
            }
            else {
              fVar5 = *(float *)((long)&p_Var26[0x41]._M_next + 4);
              fVar6 = *(float *)((long)&p_Var26[0x40]._M_next + 4);
              fVar51 = *(float *)&p_Var26[0x40]._M_prev;
              local_88._0_4_ = fVar51;
              fVar7 = *(float *)((long)&p_Var26[0x42]._M_next + 4);
              fVar8 = *(float *)((long)&p_Var26[0x43]._M_next + 4);
              fVar56 = fVar8 * (float)local_c8._12_4_ +
                       fVar7 * (float)local_c8._8_4_ +
                       fVar6 * (float)local_c8._0_4_ + (float)local_c8._4_4_ * fVar5;
              local_e0 = (_List_node_base *)CONCAT44(local_e0._4_4_,fVar56);
              fVar9 = *(float *)&p_Var26[0x41]._M_prev;
              fVar10 = *(float *)&p_Var26[0x42]._M_prev;
              fVar11 = *(float *)&p_Var26[0x43]._M_prev;
              fVar12 = *(float *)((long)&p_Var26[0x41]._M_prev + 4);
              fVar52 = *(float *)((long)&p_Var26[0x40]._M_prev + 4);
              fVar53 = *(float *)((long)&p_Var26[0x42]._M_prev + 4);
              fVar63 = *(float *)((long)&p_Var26[0x43]._M_prev + 4);
              fVar54 = *(float *)&p_Var26[0x42]._M_next;
              fVar55 = *(float *)&p_Var26[0x41]._M_next;
              fVar58 = *(float *)&p_Var26[0x43]._M_next;
              fVar59 = *(float *)&p_Var26[0x44]._M_next;
              *(float *)((long)&p_Var26[0x40]._M_next + 4) = fVar56;
              *(float *)&p_Var26[0x40]._M_prev =
                   fVar11 * (float)local_c8._12_4_ +
                   fVar10 * (float)local_c8._8_4_ +
                   fVar51 * (float)local_c8._0_4_ + (float)local_c8._4_4_ * fVar9;
              *(float *)((long)&p_Var26[0x40]._M_prev + 4) =
                   fVar63 * (float)local_c8._12_4_ +
                   fVar53 * (float)local_c8._8_4_ +
                   fVar52 * (float)local_c8._0_4_ + (float)local_c8._4_4_ * fVar12;
              *(float *)&p_Var26[0x41]._M_next =
                   (float)local_c8._12_4_ * fVar59 +
                   (float)local_c8._8_4_ * fVar58 +
                   (float)local_c8._0_4_ * fVar55 + (float)local_c8._4_4_ * fVar54;
              *(float *)((long)&p_Var26[0x41]._M_next + 4) =
                   fVar8 * (float)local_c8._28_4_ +
                   fVar7 * (float)local_c8._24_4_ +
                   fVar6 * (float)local_c8._16_4_ + (float)local_c8._20_4_ * fVar5;
              *(float *)&p_Var26[0x41]._M_prev =
                   fVar11 * (float)local_c8._28_4_ +
                   fVar10 * (float)local_c8._24_4_ +
                   fVar51 * (float)local_c8._16_4_ + (float)local_c8._20_4_ * fVar9;
              *(float *)((long)&p_Var26[0x41]._M_prev + 4) =
                   fVar63 * (float)local_c8._28_4_ +
                   fVar53 * (float)local_c8._24_4_ +
                   fVar52 * (float)local_c8._16_4_ + (float)local_c8._20_4_ * fVar12;
              *(float *)&p_Var26[0x42]._M_next =
                   (float)local_c8._28_4_ * fVar59 +
                   (float)local_c8._24_4_ * fVar58 +
                   (float)local_c8._16_4_ * fVar55 + (float)local_c8._20_4_ * fVar54;
              *(float *)((long)&p_Var26[0x42]._M_next + 4) =
                   fVar8 * local_9c +
                   fVar7 * local_a0 + fVar6 * (float)uStack_a8 + uStack_a8._4_4_ * fVar5;
              *(float *)&p_Var26[0x42]._M_prev =
                   fVar11 * local_9c +
                   fVar10 * local_a0 + fVar51 * (float)uStack_a8 + uStack_a8._4_4_ * fVar9;
              *(float *)((long)&p_Var26[0x42]._M_prev + 4) =
                   fVar63 * local_9c +
                   fVar53 * local_a0 + fVar52 * (float)uStack_a8 + uStack_a8._4_4_ * fVar12;
              *(float *)&p_Var26[0x43]._M_next =
                   local_9c * fVar59 +
                   local_a0 * fVar58 + (float)uStack_a8 * fVar55 + uStack_a8._4_4_ * fVar54;
              *(float *)((long)&p_Var26[0x43]._M_next + 4) =
                   fVar8 * local_8c + fVar7 * fStack_90 + fVar6 * fStack_98 + fVar5 * fStack_94;
              *(float *)&p_Var26[0x43]._M_prev =
                   fVar11 * local_8c + fVar10 * fStack_90 + fVar51 * fStack_98 + fVar9 * fStack_94;
              *(float *)((long)&p_Var26[0x43]._M_prev + 4) =
                   fVar63 * local_8c + fVar53 * fStack_90 + fVar52 * fStack_98 + fVar12 * fStack_94;
              *(float *)&p_Var26[0x44]._M_next =
                   fVar59 * local_8c + fVar58 * fStack_90 + fVar55 * fStack_98 + fStack_94 * fVar54;
              p_Var40 = (_List_node_base *)operator_new(0x18);
              p_Var40[1]._M_next = p_Var26;
              std::__detail::_List_node_base::_M_hook(p_Var40);
              local_58 = local_58 + 1;
              p_Var40 = p_Var41->_M_next;
              local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
                   = local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                     _M_size - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(p_Var41,0x18);
              bVar50 = false;
            }
          }
          p_Var41 = p_Var40;
          if (bVar50) goto LAB_003e3d55;
        }
        else {
LAB_003e3d55:
          p_Var40 = p_Var41->_M_next;
        }
        p_Var41 = p_Var40;
      } while (p_Var40 != (_List_node_base *)&local_f8);
    }
    pOVar49 = local_d8;
    if ((p_Var39 != (_List_node_base *)0x0) && ((long ********)local_68 != &local_68)) {
      local_d8->count_merged = local_d8->count_merged + 1;
      iVar36 = snprintf((char *)((long)&p_Var39->_M_next + 4),0x400,"$MergedNode_%i");
      ppppppplVar48 = local_68;
      iVar45 = 0;
      *(int *)&p_Var39->_M_next = iVar36;
      if ((long ********)local_68 != &local_68) {
        iVar45 = 0;
        ppppppplVar42 = local_68;
        do {
          ppppppplVar3 = ppppppplVar42 + 2;
          ppppppplVar42 = (long *******)*ppppppplVar42;
          iVar45 = iVar45 + *(int *)(*ppppppplVar3 + 0x8c);
        } while ((long ********)ppppppplVar42 != &local_68);
      }
      if (iVar45 != 0) {
        local_e0 = (_List_node_base *)
                   operator_new__((ulong)(uint)(*(int *)&p_Var39[0x46]._M_next + iVar45) << 2);
        p_Var41 = local_e0;
        if (*(int *)&p_Var39[0x46]._M_next != 0) {
          lVar46 = 0;
          uVar47 = 0;
          do {
            *(undefined4 *)((long)&local_e0->_M_next + uVar47 * 4) =
                 *(undefined4 *)((long)&(p_Var39[0x46]._M_prev)->_M_next + uVar47 * 4);
            uVar47 = uVar47 + 1;
            lVar46 = lVar46 + 4;
          } while (uVar47 < *(uint *)&p_Var39[0x46]._M_next);
          p_Var41 = (_List_node_base *)((long)&local_e0->_M_next + lVar46);
        }
        if ((long ********)ppppppplVar48 != &local_68) {
          do {
            paVar27 = (aiNode *)ppppppplVar48[2];
            if (paVar27->mNumMeshes != 0) {
              uVar47 = 0;
              do {
                uVar25 = paVar27->mMeshes[uVar47];
                *(uint *)&p_Var41->_M_next = uVar25;
                pMesh = local_d8->mScene->mMeshes[uVar25];
                fVar5 = (paVar27->mTransformation).b2;
                fVar6 = (paVar27->mTransformation).a1;
                fVar51 = (paVar27->mTransformation).a2;
                fVar7 = (paVar27->mTransformation).c3;
                fVar8 = (paVar27->mTransformation).d4;
                fVar9 = (paVar27->mTransformation).c4;
                fVar10 = (paVar27->mTransformation).d3;
                fVar11 = (paVar27->mTransformation).b3;
                fVar12 = (paVar27->mTransformation).d2;
                fVar52 = (paVar27->mTransformation).c2;
                fVar53 = (paVar27->mTransformation).b4;
                fVar63 = (paVar27->mTransformation).d1;
                fVar54 = (paVar27->mTransformation).c1;
                fVar55 = (paVar27->mTransformation).b1;
                fVar58 = (paVar27->mTransformation).a3;
                fVar59 = (paVar27->mTransformation).a4;
                if (fVar11 * fVar59 * fVar52 * fVar63 +
                    ((fVar5 * fVar59 * fVar54 * fVar10 +
                     ((fVar55 * fVar59 * fVar7 * fVar12 +
                      (((fVar9 * fVar58 * fVar5 * fVar63 +
                        ((fVar52 * fVar55 * fVar58 * fVar8 +
                         ((fVar54 * fVar53 * fVar58 * fVar12 +
                          fVar51 * fVar55 * fVar9 * fVar10 +
                          ((fVar53 * fVar51 * fVar7 * fVar63 +
                           ((fVar11 * fVar51 * fVar54 * fVar8 +
                            (((fVar52 * fVar6 * fVar53 * fVar10 +
                              ((fVar9 * fVar6 * fVar11 * fVar12 +
                               (fVar6 * fVar5 * fVar7 * fVar8 - fVar9 * fVar6 * fVar5 * fVar10)) -
                              fVar6 * fVar11 * fVar52 * fVar8)) - fVar6 * fVar53 * fVar7 * fVar12) -
                            fVar9 * fVar11 * fVar51 * fVar63)) - fVar54 * fVar53 * fVar51 * fVar10))
                          - fVar7 * fVar51 * fVar55 * fVar8)) - fVar53 * fVar58 * fVar52 * fVar63))
                        - fVar55 * fVar58 * fVar9 * fVar12)) - fVar58 * fVar5 * fVar54 * fVar8) -
                      fVar52 * fVar55 * fVar59 * fVar10)) - fVar7 * fVar5 * fVar59 * fVar63)) -
                    fVar54 * fVar11 * fVar59 * fVar12) < 0.0) {
                  FlipWindingOrderProcess::ProcessMesh(pMesh);
                }
                fVar5 = (paVar27->mTransformation).a1;
                fVar6 = (paVar27->mTransformation).a2;
                fVar51 = (paVar27->mTransformation).a3;
                fVar7 = (paVar27->mTransformation).b1;
                fVar8 = (paVar27->mTransformation).b2;
                fVar9 = (paVar27->mTransformation).b3;
                fVar10 = (paVar27->mTransformation).c1;
                fVar11 = (paVar27->mTransformation).c2;
                fVar12 = (paVar27->mTransformation).c3;
                local_d0 = (_Base_ptr)CONCAT44(local_d0._4_4_,fVar5);
                local_88 = ZEXT416((uint)fVar6);
                fVar52 = fVar7 * -fVar6;
                local_78 = (LockedSetType *)CONCAT44(local_78._4_4_,fVar7);
                fVar62 = -fVar51;
                fVar63 = fVar8 * fVar62 * fVar10 +
                         fVar51 * fVar7 * fVar11 +
                         fVar52 * fVar12 +
                         fVar6 * fVar9 * fVar10 + (fVar5 * fVar8 * fVar12 - fVar9 * fVar5 * fVar11);
                fVar61 = NAN;
                fVar51 = NAN;
                fVar54 = NAN;
                fVar55 = NAN;
                fVar53 = NAN;
                fVar58 = NAN;
                fVar59 = NAN;
                fVar56 = NAN;
                fVar60 = NAN;
                if ((fVar63 != 0.0) || (NAN(fVar63))) {
                  fVar63 = 1.0 / fVar63;
                  fVar51 = (fVar8 * fVar12 - fVar11 * fVar9) * fVar63;
                  fVar55 = (fVar6 * fVar9 + fVar8 * fVar62) * fVar63;
                  fVar58 = (fVar12 * fVar5 + fVar10 * fVar62) * fVar63;
                  fVar56 = (fVar7 * fVar11 - fVar8 * fVar10) * fVar63;
                  fVar61 = (fVar5 * fVar8 + fVar52) * fVar63;
                  fVar63 = -fVar63;
                  fVar54 = (fVar6 * fVar12 + fVar11 * fVar62) * fVar63;
                  fVar53 = (fVar7 * fVar12 - fVar9 * fVar10) * fVar63;
                  fVar59 = (fVar9 * fVar5 + fVar62 * fVar7) * fVar63;
                  fVar60 = (fVar5 * fVar11 + -fVar6 * fVar10) * fVar63;
                }
                if (pMesh->mNumVertices != 0) {
                  lVar46 = 8;
                  uVar44 = 0;
                  do {
                    paVar28 = pMesh->mVertices;
                    fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                    fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                    fVar7 = *(float *)((long)&paVar28->x + lVar46);
                    fVar8 = (paVar27->mTransformation).c2;
                    fVar9 = (paVar27->mTransformation).c1;
                    fVar10 = (paVar27->mTransformation).c3;
                    fVar11 = (paVar27->mTransformation).c4;
                    *(ulong *)((long)paVar28 + lVar46 + -8) =
                         CONCAT44((paVar27->mTransformation).b3 * fVar7 +
                                  (paVar27->mTransformation).b1 * fVar5 +
                                  (paVar27->mTransformation).b2 * fVar6 +
                                  (paVar27->mTransformation).b4,
                                  (paVar27->mTransformation).a3 * fVar7 +
                                  (paVar27->mTransformation).a1 * fVar5 +
                                  (paVar27->mTransformation).a2 * fVar6 +
                                  (paVar27->mTransformation).a4);
                    *(float *)((long)&paVar28->x + lVar46) =
                         fVar7 * fVar10 + fVar5 * fVar9 + fVar6 * fVar8 + fVar11;
                    paVar28 = pMesh->mNormals;
                    if ((paVar28 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                      fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                      fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                      fVar7 = *(float *)((long)&paVar28->x + lVar46);
                      *(ulong *)((long)paVar28 + lVar46 + -8) =
                           CONCAT44(fVar60 * fVar7 + fVar54 * fVar5 + fVar58 * fVar6,
                                    fVar56 * fVar7 + fVar51 * fVar5 + fVar53 * fVar6);
                      *(float *)((long)&paVar28->x + lVar46) =
                           fVar7 * fVar61 + fVar5 * fVar55 + fVar6 * fVar59;
                    }
                    paVar28 = pMesh->mTangents;
                    if (((paVar28 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)
                        ) && (pMesh->mNumVertices != 0)) {
                      fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                      fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                      fVar7 = *(float *)((long)&paVar28->x + lVar46);
                      *(ulong *)((long)paVar28 + lVar46 + -8) =
                           CONCAT44(fVar60 * fVar7 + fVar54 * fVar5 + fVar58 * fVar6,
                                    fVar56 * fVar7 + fVar51 * fVar5 + fVar53 * fVar6);
                      *(float *)((long)&paVar28->x + lVar46) =
                           fVar7 * fVar61 + fVar5 * fVar55 + fVar6 * fVar59;
                      paVar28 = pMesh->mBitangents;
                      fVar5 = *(float *)((long)paVar28 + lVar46 + -8);
                      fVar6 = *(float *)((long)paVar28 + lVar46 + -4);
                      fVar7 = *(float *)((long)&paVar28->x + lVar46);
                      *(ulong *)((long)paVar28 + lVar46 + -8) =
                           CONCAT44(fVar60 * fVar7 + fVar54 * fVar5 + fVar58 * fVar6,
                                    fVar56 * fVar7 + fVar51 * fVar5 + fVar53 * fVar6);
                      *(float *)((long)&paVar28->x + lVar46) =
                           fVar7 * fVar61 + fVar5 * fVar55 + fVar6 * fVar59;
                    }
                    uVar44 = uVar44 + 1;
                    lVar46 = lVar46 + 0xc;
                  } while (uVar44 < pMesh->mNumVertices);
                }
                p_Var41 = (_List_node_base *)((long)&p_Var41->_M_next + 4);
                uVar47 = uVar47 + 1;
              } while (uVar47 < paVar27->mNumMeshes);
            }
            if (paVar27 != (aiNode *)0x0) {
              aiNode::~aiNode(paVar27);
              operator_delete(paVar27,0x478);
            }
            ppppppplVar48 = (long *******)*ppppppplVar48;
          } while ((long ********)ppppppplVar48 != &local_68);
        }
        if (p_Var39[0x46]._M_prev != (_List_node_base *)0x0) {
          operator_delete__(p_Var39[0x46]._M_prev);
        }
        p_Var39[0x46]._M_prev = local_e0;
        *(int *)&p_Var39[0x46]._M_next = *(int *)&p_Var39[0x46]._M_next + iVar45;
        pOVar49 = local_d8;
      }
    }
    ppppppplVar48 = local_68;
    while ((long ********)ppppppplVar48 != &local_68) {
      ppppppplVar42 = (long *******)*ppppppplVar48;
      operator_delete(ppppppplVar48,0x18);
      ppppppplVar48 = ppppppplVar42;
    }
  }
  if ((local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
       super__List_node_base._M_next == (_List_node_base *)&local_f8) ||
     (nd->mNumChildren <
      local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size)) {
    if (nd->mChildren != (aiNode **)0x0) {
      operator_delete__(nd->mChildren);
    }
    if (local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
        super__List_node_base._M_next == (_List_node_base *)&local_f8) {
      ppaVar43 = (aiNode **)0x0;
    }
    else {
      ppaVar43 = (aiNode **)
                 operator_new__(-(ulong)(local_f8.
                                         super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                         _M_impl._M_node._M_size >> 0x3d != 0) |
                                local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>.
                                _M_impl._M_node._M_size << 3);
    }
    nd->mChildren = ppaVar43;
  }
  nd->mNumChildren =
       (uint)local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size;
  ppaVar43 = nd->mChildren;
  p_Var39 = local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_f8 && ppaVar43 != (aiNode **)0x0) {
    do {
      paVar27 = (aiNode *)p_Var39[1]._M_next;
      *ppaVar43 = paVar27;
      ppaVar43 = ppaVar43 + 1;
      paVar27->mParent = nd;
      p_Var39 = p_Var39->_M_next;
    } while (p_Var39 != (_List_node_base *)&local_f8);
  }
  pOVar49->nodes_out =
       pOVar49->nodes_out +
       (uint)local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size;
LAB_003e4e84:
  p_Var39 = local_f8.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  while (p_Var39 != (_List_node_base *)&local_f8) {
    p_Var41 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var39->_M_next)->_M_impl).
              _M_node.super__List_node_base._M_next;
    operator_delete(p_Var39,0x18);
    p_Var39 = p_Var41;
  }
  return;
}

Assistant:

void OptimizeGraphProcess::CollectNewChildren(aiNode *nd, std::list<aiNode *> &nodes) {
	nodes_in += nd->mNumChildren;

	// Process children
	std::list<aiNode *> child_nodes;
	for (unsigned int i = 0; i < nd->mNumChildren; ++i) {
		CollectNewChildren(nd->mChildren[i], child_nodes);
		nd->mChildren[i] = nullptr;
	}

	// Check whether we need this node; if not we can replace it by our own children (warn, danger of incest).
	if (locked.find(AI_OG_GETKEY(nd->mName)) == locked.end()) {
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {

			if (locked.find(AI_OG_GETKEY((*it)->mName)) == locked.end()) {
				(*it)->mTransformation = nd->mTransformation * (*it)->mTransformation;
				nodes.push_back(*it);

				it = child_nodes.erase(it);
				continue;
			}
			++it;
		}

		if (nd->mNumMeshes || !child_nodes.empty()) {
			nodes.push_back(nd);
		} else {
			delete nd; /* bye, node */
			return;
		}
	} else {

		// Retain our current position in the hierarchy
		nodes.push_back(nd);

		// Now check for possible optimizations in our list of child nodes. join as many as possible
		aiNode *join_master = nullptr;
		aiMatrix4x4 inv;

		const LockedSetType::const_iterator end = locked.end();

		std::list<aiNode *> join;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {
			aiNode *child = *it;
			if (child->mNumChildren == 0 && locked.find(AI_OG_GETKEY(child->mName)) == end) {

				// There may be no instanced meshes
				unsigned int n = 0;
				for (; n < child->mNumMeshes; ++n) {
					if (meshes[child->mMeshes[n]] > 1) {
						break;
					}
				}
				if (n == child->mNumMeshes) {
					if (!join_master) {
						join_master = child;
						inv = join_master->mTransformation;
						inv.Inverse();
					} else {
						child->mTransformation = inv * child->mTransformation;

						join.push_back(child);
						it = child_nodes.erase(it);
						continue;
					}
				}
			}
			++it;
		}
		if (join_master && !join.empty()) {
			join_master->mName.length = ::ai_snprintf(join_master->mName.data, MAXLEN, "$MergedNode_%i", count_merged++);

			unsigned int out_meshes = 0;
			for (std::list<aiNode *>::const_iterator it = join.cbegin(); it != join.cend(); ++it) {
				out_meshes += (*it)->mNumMeshes;
			}

			// copy all mesh references in one array
			if (out_meshes) {
				unsigned int *meshes = new unsigned int[out_meshes + join_master->mNumMeshes], *tmp = meshes;
				for (unsigned int n = 0; n < join_master->mNumMeshes; ++n) {
					*tmp++ = join_master->mMeshes[n];
				}

				for (const aiNode *join_node : join) {
					for (unsigned int n = 0; n < join_node->mNumMeshes; ++n) {

						*tmp = join_node->mMeshes[n];
						aiMesh *mesh = mScene->mMeshes[*tmp++];

						// Assume the transformation is affine
						// manually move the mesh into the right coordinate system

						// Check for odd negative scale (mirror)
						if (join_node->mTransformation.Determinant() < 0) {
							// Reverse the mesh face winding order
                            FlipWindingOrderProcess::ProcessMesh(mesh);
						}

                        // Update positions, normals and tangents
						const aiMatrix3x3 IT = aiMatrix3x3(join_node->mTransformation).Inverse().Transpose();
						for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {

							mesh->mVertices[a] *= join_node->mTransformation;

							if (mesh->HasNormals())
								mesh->mNormals[a] *= IT;

							if (mesh->HasTangentsAndBitangents()) {
								mesh->mTangents[a] *= IT;
								mesh->mBitangents[a] *= IT;
							}
						}
					}
					delete join_node; // bye, node
				}
				delete[] join_master->mMeshes;
				join_master->mMeshes = meshes;
				join_master->mNumMeshes += out_meshes;
			}
		}
	}
	// reassign children if something changed
	if (child_nodes.empty() || child_nodes.size() > nd->mNumChildren) {

		delete[] nd->mChildren;

		if (!child_nodes.empty()) {
			nd->mChildren = new aiNode *[child_nodes.size()];
		} else
			nd->mChildren = nullptr;
	}

	nd->mNumChildren = static_cast<unsigned int>(child_nodes.size());

	if (nd->mChildren) {
		aiNode **tmp = nd->mChildren;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end(); ++it) {
			aiNode *node = *tmp++ = *it;
			node->mParent = nd;
		}
	}

	nodes_out += static_cast<unsigned int>(child_nodes.size());
}